

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_hook.h
# Opt level: O1

void __thiscall
absl::lts_20250127::base_internal::
AtomicHook<void_(*)(const_char_*,_int,_const_char_*,_const_char_*,_const_char_*)>::Store
          (AtomicHook<void_(*)(const_char_*,_int,_const_char_*,_const_char_*,_const_char_*)> *this,
          FnPtr fn)

{
  FnPtr p_Var1;
  FnPtr p_Var2;
  bool bVar3;
  
  if (fn == (FnPtr)0x0) {
    __assert_fail("fn",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/base/internal/atomic_hook.h"
                  ,0x99,
                  "bool absl::base_internal::AtomicHook<void (*)(const char *, int, const char *, const char *, const char *)>::DoStore(FnPtr) [T = void (*)(const char *, int, const char *, const char *, const char *)]"
                 );
  }
  p_Var1 = this->default_fn_;
  LOCK();
  p_Var2 = (this->hook_)._M_b._M_p;
  bVar3 = p_Var1 == p_Var2;
  if (bVar3) {
    (this->hook_)._M_b._M_p = fn;
    p_Var2 = p_Var1;
  }
  UNLOCK();
  if (bVar3) {
    p_Var2 = p_Var1;
  }
  if (p_Var2 != fn && !bVar3) {
    __assert_fail("success",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/base/internal/atomic_hook.h"
                  ,0x6e,
                  "void absl::base_internal::AtomicHook<void (*)(const char *, int, const char *, const char *, const char *)>::Store(FnPtr) [T = void (*)(const char *, int, const char *, const char *, const char *)]"
                 );
  }
  return;
}

Assistant:

void Store(FnPtr fn) {
    bool success = DoStore(fn);
    static_cast<void>(success);
    assert(success);
  }